

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EVMMapping.c
# Opt level: O1

char * EVM_insn_name(csh handle,uint id)

{
  if (0xff < id) {
    return (char *)0x0;
  }
  return insn_name_maps[id].name;
}

Assistant:

const char *EVM_insn_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	if (id >= ARR_SIZE(insn_name_maps))
		return NULL;
	else
		return insn_name_maps[id].name;
#else
	return NULL;
#endif
}